

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O2

bool __thiscall
cmInstallCommand::MakeFilesFullPath
          (cmInstallCommand *this,char *modeName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *relFiles,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *absFiles)

{
  pointer pbVar1;
  bool bVar2;
  size_type sVar3;
  ostream *poVar4;
  pointer pbVar5;
  string file;
  ostringstream e;
  string local_1e8;
  string local_1c8;
  ostream local_1a8;
  
  pbVar5 = (relFiles->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (relFiles->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pbVar5 == pbVar1) {
LAB_002178b4:
      return pbVar5 == pbVar1;
    }
    std::__cxx11::string::string((string *)&local_1c8,(string *)pbVar5);
    sVar3 = cmGeneratorExpression::Find(&local_1c8);
    if (sVar3 != 0) {
      bVar2 = cmsys::SystemTools::FileIsFullPath(&local_1c8);
      if (!bVar2) {
        cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
        std::__cxx11::string::_M_assign((string *)&local_1c8);
        std::__cxx11::string::append((char *)&local_1c8);
        std::__cxx11::string::append((string *)&local_1c8);
      }
      if (sVar3 == 0xffffffffffffffff) {
        bVar2 = cmsys::SystemTools::FileIsDirectory(&local_1c8);
        if (bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          poVar4 = std::operator<<(&local_1a8,modeName);
          poVar4 = std::operator<<(poVar4," given directory \"");
          poVar4 = std::operator<<(poVar4,(string *)pbVar5);
          std::operator<<(poVar4,"\" to install.");
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&local_1e8);
          std::__cxx11::string::~string((string *)&local_1e8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          std::__cxx11::string::~string((string *)&local_1c8);
          goto LAB_002178b4;
        }
      }
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)absFiles,
               &local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    pbVar5 = pbVar5 + 1;
  } while( true );
}

Assistant:

bool cmInstallCommand::MakeFilesFullPath(
  const char* modeName, const std::vector<std::string>& relFiles,
  std::vector<std::string>& absFiles)
{
  for (std::string const& relFile : relFiles) {
    std::string file = relFile;
    std::string::size_type gpos = cmGeneratorExpression::Find(file);
    if (gpos != 0 && !cmSystemTools::FileIsFullPath(file)) {
      file = this->Makefile->GetCurrentSourceDirectory();
      file += "/";
      file += relFile;
    }

    // Make sure the file is not a directory.
    if (gpos == std::string::npos && cmSystemTools::FileIsDirectory(file)) {
      std::ostringstream e;
      e << modeName << " given directory \"" << relFile << "\" to install.";
      this->SetError(e.str());
      return false;
    }
    // Store the file for installation.
    absFiles.push_back(std::move(file));
  }
  return true;
}